

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

void amrex::CreateDirectoryFailed(string *dir)

{
  string msg;
  allocator local_31;
  char *local_30 [4];
  
  std::__cxx11::string::string((string *)local_30,"Couldn\'t create directory: ",&local_31);
  std::__cxx11::string::append((string *)local_30);
  Error_host(local_30[0]);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void
amrex::CreateDirectoryFailed (const std::string& dir)
{
    std::string msg("Couldn't create directory: ");
    msg += dir;
    amrex::Error(msg.c_str());
}